

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yprp_enum(lys_ypr_ctx_conflict *pctx,lysp_type_enum *items,LY_DATA_TYPE type,int8_t *flag)

{
  char *elem_name;
  uint local_64;
  uint local_54;
  ulong local_48;
  int8_t local_31;
  ulong uStack_30;
  int8_t inner_flag;
  uint64_t u;
  int8_t *flag_local;
  lysp_type_enum *plStack_18;
  LY_DATA_TYPE type_local;
  lysp_type_enum *items_local;
  lys_ypr_ctx_conflict *pctx_local;
  
  uStack_30 = 0;
  u = (uint64_t)flag;
  flag_local._4_4_ = type;
  plStack_18 = items;
  items_local = (lysp_type_enum *)pctx;
  while( true ) {
    if (plStack_18 == (lysp_type_enum *)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = *(ulong *)&plStack_18[-1].flags;
    }
    if (local_48 <= uStack_30) break;
    if (flag_local._4_4_ == LY_TYPE_BITS) {
      if (((ulong)items_local->dsc & 0x200000000) == 0) {
        local_54 = (uint)*(ushort *)&items_local->dsc << 1;
      }
      else {
        local_54 = 0;
      }
      ly_print_((ly_out *)items_local->name,"%*s<bit name=\"",(ulong)local_54,"");
      lyxml_dump_text((ly_out *)items_local->name,plStack_18[uStack_30].name,'\x01');
      ly_print_((ly_out *)items_local->name,"\"");
    }
    else {
      if (((ulong)items_local->dsc & 0x200000000) == 0) {
        local_64 = (uint)*(ushort *)&items_local->dsc << 1;
      }
      else {
        local_64 = 0;
      }
      ly_print_((ly_out *)items_local->name,"%*s<enum name=\"",(ulong)local_64,"");
      lyxml_dump_text((ly_out *)items_local->name,plStack_18[uStack_30].name,'\x01');
      ly_print_((ly_out *)items_local->name,"\"");
    }
    local_31 = '\0';
    *(short *)&items_local->dsc = *(short *)&items_local->dsc + 1;
    yprp_extension_instances
              ((lys_ypr_ctx_conflict *)items_local,LY_STMT_ENUM,'\0',plStack_18[uStack_30].exts,
               &local_31);
    yprp_iffeatures((lys_ypr_ctx_conflict *)items_local,plStack_18[uStack_30].iffeatures,
                    plStack_18[uStack_30].exts,&local_31);
    if ((plStack_18[uStack_30].flags & 0x200) != 0) {
      if (flag_local._4_4_ == LY_TYPE_BITS) {
        ypr_close_parent((lys_ypr_ctx_conflict *)items_local,&local_31);
        ypr_unsigned((lys_ypr_ctx_conflict *)items_local,LY_STMT_POSITION,'\0',
                     plStack_18[uStack_30].exts,plStack_18[uStack_30].value);
      }
      else {
        ypr_close_parent((lys_ypr_ctx_conflict *)items_local,&local_31);
        ypr_signed((lys_ypr_ctx_conflict *)items_local,LY_STMT_VALUE,'\0',plStack_18[uStack_30].exts
                   ,plStack_18[uStack_30].value);
      }
    }
    ypr_status((lys_ypr_ctx_conflict *)items_local,plStack_18[uStack_30].flags,
               plStack_18[uStack_30].exts,&local_31);
    ypr_description((lys_ypr_ctx_conflict *)items_local,plStack_18[uStack_30].dsc,
                    plStack_18[uStack_30].exts,&local_31);
    ypr_reference((lys_ypr_ctx_conflict *)items_local,plStack_18[uStack_30].ref,
                  plStack_18[uStack_30].exts,&local_31);
    *(short *)&items_local->dsc = *(short *)&items_local->dsc + -1;
    elem_name = "enum";
    if (flag_local._4_4_ == LY_TYPE_BITS) {
      elem_name = "bit";
    }
    ypr_close((lys_ypr_ctx_conflict *)items_local,elem_name,local_31);
    uStack_30 = uStack_30 + 1;
  }
  return;
}

Assistant:

static void
yprp_enum(struct lys_ypr_ctx *pctx, const struct lysp_type_enum *items, LY_DATA_TYPE type, int8_t *flag)
{
    LY_ARRAY_COUNT_TYPE u;
    int8_t inner_flag;

    (void)flag;

    LY_ARRAY_FOR(items, u) {
        if (type == LY_TYPE_BITS) {
            ly_print_(pctx->out, "%*s<bit name=\"", INDENT);
            lyxml_dump_text(pctx->out, items[u].name, 1);
            ly_print_(pctx->out, "\"");
        } else { /* LY_TYPE_ENUM */
            ly_print_(pctx->out, "%*s<enum name=\"", INDENT);
            lyxml_dump_text(pctx->out, items[u].name, 1);
            ly_print_(pctx->out, "\"");
        }
        inner_flag = 0;
        LEVEL++;
        yprp_extension_instances(pctx, LY_STMT_ENUM, 0, items[u].exts, &inner_flag);
        yprp_iffeatures(pctx, items[u].iffeatures, items[u].exts, &inner_flag);
        if (items[u].flags & LYS_SET_VALUE) {
            if (type == LY_TYPE_BITS) {
                ypr_close_parent(pctx, &inner_flag);
                ypr_unsigned(pctx, LY_STMT_POSITION, 0, items[u].exts, items[u].value);
            } else { /* LY_TYPE_ENUM */
                ypr_close_parent(pctx, &inner_flag);
                ypr_signed(pctx, LY_STMT_VALUE, 0, items[u].exts, items[u].value);
            }
        }
        ypr_status(pctx, items[u].flags, items[u].exts, &inner_flag);
        ypr_description(pctx, items[u].dsc, items[u].exts, &inner_flag);
        ypr_reference(pctx, items[u].ref, items[u].exts, &inner_flag);
        LEVEL--;
        ypr_close(pctx, type == LY_TYPE_BITS ? "bit" : "enum", inner_flag);
    }
}